

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistage_vector_quantization.cc
# Opt level: O0

bool __thiscall
sptk::MultistageVectorQuantization::Run
          (MultistageVectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,Buffer *buffer)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  long in_R8;
  int n;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  int local_5c;
  
  iVar1 = *(int *)(in_RDI._M_current + 1);
  if ((((((ulong)in_RDI._M_current[8] & 1) != 0) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 == (long)(iVar1 + 1))) &&
      (sVar3 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::size(in_RDX), sVar3 == (long)*(int *)((long)in_RDI._M_current + 0xc))) &&
     ((in_RCX != (vector<int,_std::allocator<int>_> *)0x0 && (in_R8 != 0)))) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
    if (sVar3 != (long)*(int *)((long)in_RDI._M_current + 0xc)) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70._M_current,
                 (size_type)in_RDI._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 8));
    if (sVar3 != (long)(iVar1 + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70._M_current,
                 (size_type)in_RDI._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI);
    local_5c = 0;
    while( true ) {
      if (*(int *)((long)in_RDI._M_current + 0xc) <= local_5c) {
        return true;
      }
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::operator[](in_RDX,(long)local_5c);
      std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_5c);
      bVar2 = VectorQuantization::Run
                        ((VectorQuantization *)in_stack_ffffffffffffff98._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffff90._M_current,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)in_stack_ffffffffffffff88._M_current,
                         (int *)in_stack_ffffffffffffff80._M_current);
      if (!bVar2) break;
      if (local_5c < *(int *)((long)in_RDI._M_current + 0xc) + -1) {
        in_stack_ffffffffffffff98 =
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff90 =
             std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff48 =
             (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](in_RDX,(long)local_5c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_5c);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_ffffffffffffff48,(long)*pvVar4);
        in_stack_ffffffffffffff88 =
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff80 =
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::MultistageVectorQuantization::Run(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::allocator<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>>const&,std::vector<int,std::allocator<int>>*,sptk::MultistageVectorQuantization::Buffer*)const::__0>
                  (in_stack_ffffffffffffff98._M_current,in_stack_ffffffffffffff90._M_current,
                   in_stack_ffffffffffffff88._M_current,in_stack_ffffffffffffff80._M_current);
      }
      local_5c = local_5c + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool MultistageVectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<std::vector<double> > >& codebook_vectors,
    std::vector<int>* codebook_indices,
    MultistageVectorQuantization::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || input_vector.size() != static_cast<std::size_t>(length) ||
      codebook_vectors.size() != static_cast<std::size_t>(num_stage_) ||
      NULL == codebook_indices || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_stage_)) {
    codebook_indices->resize(num_stage_);
  }
  if (buffer->quantization_error_.size() != static_cast<std::size_t>(length)) {
    buffer->quantization_error_.resize(length);
  }

  // Initialize quantization error.
  std::copy(input_vector.begin(), input_vector.end(),
            buffer->quantization_error_.begin());

  for (int n(0); n < num_stage_; ++n) {
    if (!vector_quantization_.Run(buffer->quantization_error_,
                                  codebook_vectors[n],
                                  &((*codebook_indices)[n]))) {
      return false;
    }

    if (n < num_stage_ - 1) {
      std::transform(buffer->quantization_error_.begin(),
                     buffer->quantization_error_.end(),
                     codebook_vectors[n][(*codebook_indices)[n]].begin(),
                     buffer->quantization_error_.begin(),
                     [](double e, double c) { return e - c; });
    }
  }

  return true;
}